

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMoveCcrEa<(moira::Instr)73,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Av<(moira::Instr)73,_(moira::Mode)6,_2> local_48 [2];
  int local_40;
  undefined1 local_38 [8];
  Ea<(moira::Mode)6,_2> dst;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext2._2_2_ = op;
  unique0x1000014f = addr;
  Op<(moira::Mode)6,2>((Ea<(moira::Mode)6,_2> *)local_38,this,op & 7,addr);
  if (str->style->syntax == MUSASHI) {
    pSVar1 = StrWriter::operator<<(str);
    local_40 = (str->tab).raw;
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_40);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)6,_2> *)local_38);
    local_48[0].ext1 = 0;
    StrWriter::operator<<(pSVar1,local_48);
  }
  else {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)6,_2> *)local_38);
  }
  return;
}

Assistant:

void
Moira::dasmMoveCcrEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Ccr{} << Sep{} << dst << Av<I, M, S>{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ccr{} << Sep{} << dst;
    }
}